

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

float quick_select_float(float *arr,int n)

{
  float fVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  float t;
  float fVar11;
  float t_1;
  float fVar12;
  
  iVar6 = (int)(n - 1U) / 2;
  iVar9 = 0;
  uVar8 = n - 1U;
  do {
    if ((int)uVar8 <= iVar9) {
LAB_001edb45:
      return arr[iVar6];
    }
    uVar5 = iVar9 + 1;
    uVar10 = (ulong)uVar5;
    if (uVar8 == uVar5) {
      fVar11 = arr[iVar9];
      if (arr[(int)uVar8] < fVar11) {
        arr[iVar9] = arr[(int)uVar8];
        arr[(int)uVar8] = fVar11;
      }
      goto LAB_001edb45;
    }
    iVar3 = (int)(iVar9 + uVar8) / 2;
    fVar11 = arr[iVar3];
    fVar12 = arr[(int)uVar8];
    if (fVar12 < fVar11) {
      arr[iVar3] = fVar12;
      arr[(int)uVar8] = fVar11;
      fVar12 = fVar11;
    }
    fVar11 = arr[iVar9];
    if (fVar12 < fVar11) {
      arr[iVar9] = fVar12;
      arr[(int)uVar8] = fVar11;
      fVar11 = arr[iVar9];
    }
    fVar12 = arr[iVar3];
    if (fVar11 < fVar12) {
      arr[iVar3] = fVar11;
      arr[iVar9] = fVar12;
      fVar12 = arr[iVar3];
    }
    arr[iVar3] = arr[(int)uVar5];
    arr[(int)uVar5] = fVar12;
    uVar5 = uVar8;
    while( true ) {
      fVar11 = arr[iVar9];
      uVar10 = (ulong)(int)uVar10;
      do {
        fVar12 = arr[uVar10 + 1];
        uVar10 = uVar10 + 1;
      } while (fVar12 < fVar11);
      lVar2 = (long)(int)uVar5 + 1;
      do {
        uVar4 = uVar5;
        lVar7 = lVar2;
        fVar1 = arr[lVar7 + -2];
        uVar5 = uVar4 - 1;
        lVar2 = lVar7 + -1;
      } while (fVar11 < fVar1);
      if (lVar7 + -1 <= (long)uVar10) break;
      arr[uVar10] = fVar1;
      arr[lVar7 + -2] = fVar12;
    }
    arr[iVar9] = fVar1;
    arr[lVar7 + -2] = fVar11;
    if ((int)uVar5 <= iVar6) {
      iVar9 = (int)uVar10;
    }
    if (iVar6 < (int)uVar4) {
      uVar8 = uVar4 - 2;
    }
  } while( true );
}

Assistant:

static float quick_select_float(float arr[], int n) 
{
    int low, high ;
    int median;
    int middle, ll, hh;

    low = 0 ; high = n-1 ; median = (low + high) / 2;
    for (;;) {
        if (high <= low) /* One element only */
            return arr[median] ;

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]) ;
            return arr[median] ;
        }

    /* Find median of low, middle and high items; swap into position low */
    middle = (low + high) / 2;
    if (arr[middle] > arr[high])    ELEM_SWAP(arr[middle], arr[high]) ;
    if (arr[low] > arr[high])       ELEM_SWAP(arr[low], arr[high]) ;
    if (arr[middle] > arr[low])     ELEM_SWAP(arr[middle], arr[low]) ;

    /* Swap low item (now in position middle) into position (low+1) */
    ELEM_SWAP(arr[middle], arr[low+1]) ;

    /* Nibble from each end towards middle, swapping items when stuck */
    ll = low + 1;
    hh = high;
    for (;;) {
        do ll++; while (arr[low] > arr[ll]) ;
        do hh--; while (arr[hh]  > arr[low]) ;

        if (hh < ll)
        break;

        ELEM_SWAP(arr[ll], arr[hh]) ;
    }

    /* Swap middle item (in position low) back into correct position */
    ELEM_SWAP(arr[low], arr[hh]) ;

    /* Re-set active partition */
    if (hh <= median)
        low = ll;
        if (hh >= median)
        high = hh - 1;
    }
}